

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.c
# Opt level: O0

char * glfwGetJoystickGUID(int jid)

{
  int iVar1;
  _GLFWjoystick *js;
  char *pcStack_10;
  int jid_local;
  
  if (jid < 0) {
    __assert_fail("jid >= GLFW_JOYSTICK_1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/bernhardfritz[P]mariobreaksout/lib/piksel/lib/glfw/src/input.c"
                  ,0x3f9,"const char *glfwGetJoystickGUID(int)");
  }
  if (jid < 0x10) {
    if (_glfw.initialized == 0) {
      _glfwInputError(0x10001,(char *)0x0);
      pcStack_10 = (char *)0x0;
    }
    else if ((jid < 0) || (0xf < jid)) {
      _glfwInputError(0x10003,"Invalid joystick ID %i",(ulong)(uint)jid);
      pcStack_10 = (char *)0x0;
    }
    else if (_glfw.joysticks[jid].present == 0) {
      pcStack_10 = (char *)0x0;
    }
    else {
      iVar1 = _glfwPlatformPollJoystick(_glfw.joysticks + jid,0);
      if (iVar1 == 0) {
        pcStack_10 = (char *)0x0;
      }
      else {
        pcStack_10 = _glfw.joysticks[jid].guid;
      }
    }
    return pcStack_10;
  }
  __assert_fail("jid <= GLFW_JOYSTICK_LAST",
                "/workspace/llm4binary/github/license_all_cmakelists_25/bernhardfritz[P]mariobreaksout/lib/piksel/lib/glfw/src/input.c"
                ,0x3fa,"const char *glfwGetJoystickGUID(int)");
}

Assistant:

GLFWAPI const char* glfwGetJoystickGUID(int jid)
{
    _GLFWjoystick* js;

    assert(jid >= GLFW_JOYSTICK_1);
    assert(jid <= GLFW_JOYSTICK_LAST);

    _GLFW_REQUIRE_INIT_OR_RETURN(NULL);

    if (jid < 0 || jid > GLFW_JOYSTICK_LAST)
    {
        _glfwInputError(GLFW_INVALID_ENUM, "Invalid joystick ID %i", jid);
        return NULL;
    }

    js = _glfw.joysticks + jid;
    if (!js->present)
        return NULL;

    if (!_glfwPlatformPollJoystick(js, _GLFW_POLL_PRESENCE))
        return NULL;

    return js->guid;
}